

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw1_subh0_w16_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m256i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint in_ECX;
  long in_RDX;
  void *in_RSI;
  undefined4 in_R9D;
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  long in_stack_00000008;
  __m256i m0_ac;
  __m256i m_i00;
  int j;
  int i;
  __m256i zeros;
  __m256i one_b;
  __m256i v_maxval;
  int in_stack_fffffffffffffd48;
  int local_228;
  int local_224;
  ulong uStack_218;
  CONV_BUF_TYPE *in_stack_fffffffffffffe40;
  CONV_BUF_TYPE *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  long local_198;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  __m256i *palStack_78;
  __m256i *palStack_70;
  __m256i *palStack_68;
  
  auVar1 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar1 = vpinsrw_avx(auVar1,0x40,2);
  auVar1 = vpinsrw_avx(auVar1,0x40,3);
  auVar1 = vpinsrw_avx(auVar1,0x40,4);
  auVar1 = vpinsrw_avx(auVar1,0x40,5);
  auVar1 = vpinsrw_avx(auVar1,0x40,6);
  auVar1 = vpinsrw_avx(auVar1,0x40,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  auVar2 = vpinsrw_avx(auVar2,0x40,7);
  palStack_78 = auVar1._8_8_;
  palStack_70 = auVar2._0_8_;
  palStack_68 = auVar2._8_8_;
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  auVar1 = vpinsrb_avx(auVar1,1,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar2 = vpinsrb_avx(auVar2,1,2);
  auVar2 = vpinsrb_avx(auVar2,1,3);
  auVar2 = vpinsrb_avx(auVar2,1,4);
  auVar2 = vpinsrb_avx(auVar2,1,5);
  auVar2 = vpinsrb_avx(auVar2,1,6);
  auVar2 = vpinsrb_avx(auVar2,1,7);
  auVar2 = vpinsrb_avx(auVar2,1,8);
  auVar2 = vpinsrb_avx(auVar2,1,9);
  auVar2 = vpinsrb_avx(auVar2,1,10);
  auVar2 = vpinsrb_avx(auVar2,1,0xb);
  auVar2 = vpinsrb_avx(auVar2,1,0xc);
  auVar2 = vpinsrb_avx(auVar2,1,0xd);
  auVar2 = vpinsrb_avx(auVar2,1,0xe);
  auVar2 = vpinsrb_avx(auVar2,1,0xf);
  uStack_f0 = auVar2._0_8_;
  uStack_e8 = auVar2._8_8_;
  auVar5 = ZEXT3264(ZEXT832(0) << 0x20);
  local_198 = in_RDX;
  for (local_224 = 0; local_224 < (int)mask_stride; local_224 = local_224 + 1) {
    for (local_228 = 0; auVar4 = auVar5._0_32_, local_228 < h; local_228 = local_228 + 0x10) {
      yy_loadu_256((__m256i *)(in_stack_00000008 + (local_228 << 1)),in_RSI);
      auVar3._16_8_ = uStack_f0;
      auVar3._0_16_ = auVar1;
      auVar3._24_8_ = uStack_e8;
      auVar4 = vpmaddubsw_avx2(auVar4,auVar3);
      uStack_218 = SUB328(ZEXT832(0),4);
      auVar4 = vpavgw_avx2(auVar4,ZEXT832(uStack_218) << 0x40);
      in_RSI = (void *)(local_198 + (long)local_228 * 2);
      auVar5 = ZEXT1664(auVar4._0_16_);
      blend_a64_d16_mask_w16_avx2
                ((uint8_t *)CONCAT44(in_R9D,in_stack_fffffffffffffe50),in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe40,palStack_68,palStack_70,palStack_78,
                 in_stack_fffffffffffffd48);
    }
    in_stack_00000008 = in_stack_00000008 + ((ulong)mask & 0xffffffff);
    local_198 = local_198 + (ulong)in_ECX * 2;
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw1_subh0_w16_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m256i *round_offset, int shift) {
  const __m256i v_maxval = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m256i one_b = _mm256_set1_epi8(1);
  const __m256i zeros = _mm256_setzero_si256();
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 16) {
      const __m256i m_i00 = yy_loadu_256(mask + 2 * j);
      const __m256i m0_ac = _mm256_maddubs_epi16(m_i00, one_b);
      const __m256i m0 = _mm256_avg_epu16(m0_ac, zeros);

      blend_a64_d16_mask_w16_avx2(dst + j, src0 + j, src1 + j, &m0,
                                  round_offset, &v_maxval, shift);
    }
    mask += mask_stride;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}